

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-write-test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  mtar_t tar;
  mtar_t mStack_78;
  
  if (argc < 2) {
    puts("error: no argument");
    iVar2 = 1;
  }
  else {
    uVar1 = mtar_open(&mStack_78,argv[1],"w");
    if (uVar1 == 0) {
      mtar_write_file_header(&mStack_78,"test1.txt",0xb);
      mtar_write_data(&mStack_78,"Hello world",0xb);
      mtar_write_file_header(&mStack_78,"test2.txt",0xd);
      mtar_write_data(&mStack_78,"Goodbye world",0xd);
      uVar1 = mtar_finalize(&mStack_78);
      if (uVar1 == 0) {
        uVar1 = mtar_close(&mStack_78);
        if (uVar1 == 0) {
          puts("success");
          iVar2 = 0;
        }
        else {
          printf("error: %d\n",(ulong)uVar1);
          iVar2 = 4;
        }
      }
      else {
        printf("error: %d\n",(ulong)uVar1);
        iVar2 = 3;
      }
    }
    else {
      printf("error: %d\n",(ulong)uVar1);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    const char *str1 = "Hello world";
    const char *str2 = "Goodbye world";

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    if (int error = mtar_open(&tar, argv[1], "w"))
    {
        printf("error: %d\n", error);
        return 2;
    }

    mtar_write_file_header(&tar, "test1.txt", strlen(str1));
    mtar_write_data(&tar, str1, strlen(str1));
    mtar_write_file_header(&tar, "test2.txt", strlen(str2));
    mtar_write_data(&tar, str2, strlen(str2));

    if (int error = mtar_finalize(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 4;
    }

    puts("success");
    return 0;
}